

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

void __thiscall capnp::compiler::Compiler::Compiler(Compiler *this,AnnotationFlag annotationFlag)

{
  AnnotationFlag local_2c;
  Own<capnp::compiler::Compiler::Impl> local_28;
  
  (this->super_LazyLoadCallback)._vptr_LazyLoadCallback = (_func_int **)&PTR_load_006766d0;
  local_2c = annotationFlag;
  kj::heap<capnp::compiler::Compiler::Impl,capnp::compiler::Compiler::AnnotationFlag&>
            ((kj *)&local_28,&local_2c);
  kj::MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl>>::
  MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl>>
            ((MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl>> *)&this->impl,&local_28);
  kj::Own<capnp::compiler::Compiler::Impl>::dispose(&local_28);
  SchemaLoader::SchemaLoader(&this->loader,&this->super_LazyLoadCallback);
  return;
}

Assistant:

Compiler::Compiler(AnnotationFlag annotationFlag)
    : impl(kj::heap<Impl>(annotationFlag)),
      loader(*this) {}